

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_statemach_act(connectdata *conn)

{
  curl_ftpauth cVar1;
  long lVar2;
  size_t sVar3;
  CURLcode CVar4;
  int iVar5;
  char *pcVar6;
  _func_CURLcode_connectdata_ptr *first;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  _func_CURLcode_connectdata_ptr *local_88;
  char *store_1;
  char *os;
  char *ptr_1;
  char *store;
  _Bool entry_extracted;
  char *dir;
  size_t buf_size;
  char *ptr;
  size_t nread;
  pingpong *pp;
  ftp_conn *ftpc;
  Curl_easy *pCStack_28;
  int ftpcode;
  Curl_easy *data;
  curl_socket_t sock;
  CURLcode result;
  connectdata *conn_local;
  
  data._0_4_ = conn->sock[0];
  pCStack_28 = conn->data;
  nread = (size_t)&conn->proto;
  ptr = (char *)0x0;
  pp = (pingpong *)nread;
  _sock = conn;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar4 = Curl_pp_flushsend((pingpong *)nread);
    return CVar4;
  }
  data._4_4_ = ftp_readresp((curl_socket_t)data,(pingpong *)nread,(int *)((long)&ftpc + 4),
                            (size_t *)&ptr);
  if (data._4_4_ != CURLE_OK) {
    return data._4_4_;
  }
  if (ftpc._4_4_ == 0) {
    return CURLE_OK;
  }
  switch(*(undefined4 *)&pp[1].response.field_0xc) {
  case 1:
    if (ftpc._4_4_ == 0xe6) {
      CVar4 = ftp_state_user_resp(_sock,0xe6,*(ftpstate *)&pp[1].response.field_0xc);
      return CVar4;
    }
    if (ftpc._4_4_ != 0xdc) {
      Curl_failf(pCStack_28,"Got a %03d ftp-server response when 220 was expected",(ulong)ftpc._4_4_
                );
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if (((pCStack_28->set).use_ssl != CURLUSESSL_NONE) &&
       (((_sock->ssl[0].use & 1U) == 0 ||
        ((((_sock->bits).proxy_ssl_connected[0] & 1U) != 0 && ((_sock->proxy_ssl[0].use & 1U) == 0))
        )))) {
      pp[1].response.tv_usec = 0;
      cVar1 = (pCStack_28->set).ftpsslauth;
      if (cVar1 < CURLFTPAUTH_TLS) {
        *(undefined4 *)((long)&pp[1].response.tv_sec + 4) = 1;
        *(undefined4 *)&pp[1].response.tv_sec = 0;
      }
      else {
        if (cVar1 != CURLFTPAUTH_TLS) {
          Curl_failf(pCStack_28,"unsupported parameter to CURLOPT_FTPSSLAUTH: %d",
                     (ulong)(pCStack_28->set).ftpsslauth);
          return CURLE_UNKNOWN_OPTION;
        }
        *(undefined4 *)((long)&pp[1].response.tv_sec + 4) = 0xffffffff;
        *(undefined4 *)&pp[1].response.tv_sec = 1;
      }
      data._4_4_ = Curl_pp_sendf(pp,"AUTH %s",
                                 ftp_statemach_act::ftpauth + (int)pp[1].response.tv_sec);
      if (data._4_4_ == CURLE_OK) {
        _state(_sock,FTP_AUTH);
        return data._4_4_;
      }
      return data._4_4_;
    }
    data._4_4_ = ftp_state_user(_sock);
    goto joined_r0x0011e329;
  case 2:
    if ((ftpc._4_4_ == 0xea) || (ftpc._4_4_ == 0x14e)) {
      data._4_4_ = Curl_ssl_connect(_sock,0);
      if (data._4_4_ == CURLE_OK) {
        (_sock->bits).ftp_use_data_ssl = false;
        data._4_4_ = ftp_state_user(_sock);
      }
    }
    else if (pp[1].response.tv_usec < 1) {
      pp[1].response.tv_usec = pp[1].response.tv_usec + 1;
      *(int *)&pp[1].response.tv_sec =
           *(int *)((long)&pp[1].response.tv_sec + 4) + (int)pp[1].response.tv_sec;
      data._4_4_ = Curl_pp_sendf(pp,"AUTH %s",
                                 ftp_statemach_act::ftpauth + (int)pp[1].response.tv_sec);
    }
    else if ((pCStack_28->set).use_ssl < CURLUSESSL_CONTROL) {
      data._4_4_ = ftp_state_user(_sock);
    }
    else {
      data._4_4_ = CURLE_USE_SSL_FAILED;
    }
    if (data._4_4_ != CURLE_OK) {
      return data._4_4_;
    }
    break;
  case 3:
  case 4:
    data._4_4_ = ftp_state_user_resp(_sock,ftpc._4_4_,*(ftpstate *)&pp[1].response.field_0xc);
    break;
  case 5:
    data._4_4_ = ftp_state_acct_resp(_sock,ftpc._4_4_);
    break;
  case 6:
    uVar7 = 0x50;
    if ((pCStack_28->set).use_ssl == CURLUSESSL_CONTROL) {
      uVar7 = 0x43;
    }
    data._4_4_ = Curl_pp_sendf(pp,"PROT %c",uVar7);
    if (data._4_4_ != CURLE_OK) {
      return data._4_4_;
    }
    _state(_sock,FTP_PROT);
    break;
  case 7:
    if ((int)ftpc._4_4_ / 100 == 2) {
      (_sock->bits).ftp_use_data_ssl = (pCStack_28->set).use_ssl != CURLUSESSL_CONTROL;
    }
    else if (CURLUSESSL_CONTROL < (pCStack_28->set).use_ssl) {
      return CURLE_USE_SSL_FAILED;
    }
    if ((pCStack_28->set).ftp_ccc != CURLFTPSSL_CCC_NONE) {
      data._4_4_ = Curl_pp_sendf(pp,"%s","CCC");
      if (data._4_4_ == CURLE_OK) {
        _state(_sock,FTP_CCC);
        return data._4_4_;
      }
      return data._4_4_;
    }
    data._4_4_ = ftp_state_pwd(_sock);
    goto joined_r0x0011e329;
  case 8:
    if (((int)ftpc._4_4_ < 500) && (data._4_4_ = Curl_ssl_shutdown(_sock,0), data._4_4_ != CURLE_OK)
       ) {
      Curl_failf(_sock->data,"Failed to clear the command channel (CCC)");
      return data._4_4_;
    }
    data._4_4_ = 0;
    data._4_4_ = ftp_state_pwd(_sock);
    goto joined_r0x0011e329;
  case 9:
    if (ftpc._4_4_ == 0x101) {
      buf_size = (size_t)((pCStack_28->state).buffer + 4);
      lVar2 = (pCStack_28->set).buffer_size;
      bVar9 = false;
      pcVar6 = (char *)(*Curl_cmalloc)((size_t)(ptr + 1));
      if (pcVar6 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      while( true ) {
        bVar8 = false;
        if (((buf_size < (pCStack_28->state).buffer + lVar2) &&
            (bVar8 = false, *(char *)buf_size != '\n')) &&
           (bVar8 = false, *(char *)buf_size != '\0')) {
          bVar8 = *(char *)buf_size != '\"';
        }
        if (!bVar8) break;
        buf_size = buf_size + 1;
      }
      ptr_1 = pcVar6;
      sVar3 = buf_size;
      if (*(char *)buf_size == '\"') {
        while (buf_size = sVar3 + 1, *(char *)buf_size != '\0') {
          if (*(char *)buf_size == '\"') {
            if (*(char *)(sVar3 + 2) != '\"') {
              bVar9 = true;
              break;
            }
            *ptr_1 = *(char *)(sVar3 + 2);
            buf_size = sVar3 + 2;
          }
          else {
            *ptr_1 = *(char *)buf_size;
          }
          ptr_1 = ptr_1 + 1;
          sVar3 = buf_size;
        }
        *ptr_1 = '\0';
      }
      if (bVar9) {
        if ((pp[1].statemach_act == (_func_CURLcode_connectdata_ptr *)0x0) && (*pcVar6 != '/')) {
          data._4_4_ = Curl_pp_sendf(pp,"%s","SYST");
          if (data._4_4_ == CURLE_OK) {
            (*Curl_cfree)(pp[1].cache);
            pp[1].cache = (char *)0x0;
            pp[1].cache = pcVar6;
            Curl_infof(pCStack_28,"Entry path is \'%s\'\n",pp[1].cache);
            (pCStack_28->state).most_recent_ftp_entrypath = pp[1].cache;
            _state(_sock,FTP_SYST);
            return data._4_4_;
          }
          (*Curl_cfree)(pcVar6);
          return data._4_4_;
        }
        (*Curl_cfree)(pp[1].cache);
        pp[1].cache = (char *)0x0;
        pp[1].cache = pcVar6;
        Curl_infof(pCStack_28,"Entry path is \'%s\'\n",pp[1].cache);
        (pCStack_28->state).most_recent_ftp_entrypath = pp[1].cache;
      }
      else {
        (*Curl_cfree)(pcVar6);
        Curl_infof(pCStack_28,"Failed to figure out path\n");
      }
    }
    _state(_sock,FTP_STOP);
    break;
  case 10:
    if (ftpc._4_4_ == 0xd7) {
      os = (pCStack_28->state).buffer + 4;
      first = (_func_CURLcode_connectdata_ptr *)(*Curl_cmalloc)((size_t)(ptr + 1));
      if (first == (_func_CURLcode_connectdata_ptr *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      for (; local_88 = first, *os == ' '; os = os + 1) {
      }
      while( true ) {
        bVar9 = false;
        if (*os != '\0') {
          bVar9 = *os != ' ';
        }
        if (!bVar9) break;
        *local_88 = (_func_CURLcode_connectdata_ptr)*os;
        local_88 = local_88 + 1;
        os = os + 1;
      }
      *local_88 = (_func_CURLcode_connectdata_ptr)0x0;
      iVar5 = Curl_strcasecompare((char *)first,"OS/400");
      if (iVar5 != 0) {
        data._4_4_ = Curl_pp_sendf(pp,"%s","SITE NAMEFMT 1");
        if (data._4_4_ == CURLE_OK) {
          (*Curl_cfree)(pp[1].statemach_act);
          pp[1].statemach_act = (_func_CURLcode_connectdata_ptr *)0x0;
          pp[1].statemach_act = first;
          _state(_sock,FTP_NAMEFMT);
          return data._4_4_;
        }
        (*Curl_cfree)(first);
        return data._4_4_;
      }
      (*Curl_cfree)(pp[1].statemach_act);
      pp[1].statemach_act = (_func_CURLcode_connectdata_ptr *)0x0;
      pp[1].statemach_act = first;
    }
    _state(_sock,FTP_STOP);
    break;
  case 0xb:
    if (ftpc._4_4_ == 0xfa) {
      ftp_state_pwd(_sock);
    }
    else {
      _state(_sock,FTP_STOP);
    }
    break;
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    if ((399 < (int)ftpc._4_4_) && (*(int *)((long)&pp[1].response.tv_sec + 4) == 0)) {
      Curl_failf(_sock->data,"QUOT command failed with %03d",(ulong)ftpc._4_4_);
      return CURLE_QUOTE_ERROR;
    }
    data._4_4_ = ftp_state_quote(_sock,false,*(ftpstate *)&pp[1].response.field_0xc);
    goto joined_r0x0011e329;
  case 0x10:
    if ((int)ftpc._4_4_ / 100 != 2) {
      if ((((_sock->data->set).ftp_create_missing_dirs != 0) && (*(int *)&pp[1].field_0x24 != 0)) &&
         (*(int *)((long)&pp[1].response.tv_sec + 4) == 0)) {
        *(int *)((long)&pp[1].response.tv_sec + 4) = *(int *)((long)&pp[1].response.tv_sec + 4) + 1;
        data._4_4_ = Curl_pp_sendf(pp,"MKD %s",
                                   *(undefined8 *)
                                    (pp[1].cache_size + (long)(*(int *)&pp[1].field_0x24 + -1) * 8))
        ;
        if (data._4_4_ == CURLE_OK) {
          _state(_sock,FTP_MKD);
          return data._4_4_;
        }
        return data._4_4_;
      }
      Curl_failf(pCStack_28,"Server denied you to change to the given directory",
                 (long)(int)ftpc._4_4_ % 100 & 0xffffffff);
      *(undefined1 *)&pp[1].sendthis = 1;
      return CURLE_REMOTE_ACCESS_DENIED;
    }
    *(undefined4 *)((long)&pp[1].response.tv_sec + 4) = 0;
    iVar5 = *(int *)&pp[1].field_0x24 + 1;
    *(int *)&pp[1].field_0x24 = iVar5;
    if ((int)pp[1].nread_resp < iVar5) {
      data._4_4_ = ftp_state_mdtm(_sock);
    }
    else {
      data._4_4_ = Curl_pp_sendf(pp,"CWD %s",
                                 *(undefined8 *)
                                  (pp[1].cache_size + (long)(*(int *)&pp[1].field_0x24 + -1) * 8));
    }
    goto joined_r0x0011e329;
  case 0x11:
    if (((int)ftpc._4_4_ / 100 != 2) &&
       (iVar5 = pp[1].response.tv_usec, pp[1].response.tv_usec = iVar5 + -1, iVar5 == 0)) {
      Curl_failf(pCStack_28,"Failed to MKD dir: %03d",(ulong)ftpc._4_4_);
      return CURLE_REMOTE_ACCESS_DENIED;
    }
    _state(_sock,FTP_CWD);
    data._4_4_ = Curl_pp_sendf(pp,"CWD %s",
                               *(undefined8 *)
                                (pp[1].cache_size + (long)(*(int *)&pp[1].field_0x24 + -1) * 8));
joined_r0x0011e329:
    if (data._4_4_ != CURLE_OK) {
      return data._4_4_;
    }
    break;
  case 0x12:
    data._4_4_ = ftp_state_mdtm_resp(_sock,ftpc._4_4_);
    break;
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
    data._4_4_ = ftp_state_type_resp(_sock,ftpc._4_4_,*(ftpstate *)&pp[1].response.field_0xc);
    break;
  case 0x17:
  case 0x18:
  case 0x19:
    data._4_4_ = ftp_state_size_resp(_sock,ftpc._4_4_,*(ftpstate *)&pp[1].response.field_0xc);
    break;
  case 0x1a:
  case 0x1b:
    data._4_4_ = ftp_state_rest_resp(_sock,ftpc._4_4_,*(ftpstate *)&pp[1].response.field_0xc);
    break;
  case 0x1c:
    data._4_4_ = ftp_state_port_resp(_sock,ftpc._4_4_);
    break;
  case 0x1d:
    if (ftpc._4_4_ != 200) {
      Curl_failf(pCStack_28,"PRET command not accepted: %03d",(ulong)ftpc._4_4_);
      return CURLE_FTP_PRET_FAILED;
    }
    data._4_4_ = ftp_state_use_pasv(_sock);
    break;
  case 0x1e:
    data._4_4_ = ftp_state_pasv_resp(_sock,ftpc._4_4_);
    break;
  case 0x1f:
  case 0x20:
    data._4_4_ = ftp_state_get_resp(_sock,ftpc._4_4_,*(ftpstate *)&pp[1].response.field_0xc);
    break;
  case 0x21:
    data._4_4_ = ftp_state_stor_resp(_sock,ftpc._4_4_,*(ftpstate *)&pp[1].response.field_0xc);
    break;
  case 0x22:
  default:
    _state(_sock,FTP_STOP);
  }
  return data._4_4_;
}

Assistant:

static CURLcode ftp_statemach_act(struct connectdata *conn)
{
  CURLcode result;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  struct Curl_easy *data = conn->data;
  int ftpcode;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  static const char ftpauth[][4]  = { "SSL", "TLS" };
  size_t nread = 0;

  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  result = ftp_readresp(sock, pp, &ftpcode, &nread);
  if(result)
    return result;

  if(ftpcode) {
    /* we have now received a full FTP server response */
    switch(ftpc->state) {
    case FTP_WAIT220:
      if(ftpcode == 230)
        /* 230 User logged in - already! */
        return ftp_state_user_resp(conn, ftpcode, ftpc->state);
      else if(ftpcode != 220) {
        failf(data, "Got a %03d ftp-server response when 220 was expected",
              ftpcode);
        return CURLE_WEIRD_SERVER_REPLY;
      }

      /* We have received a 220 response fine, now we proceed. */
#ifdef HAVE_GSSAPI
      if(data->set.krb) {
        /* If not anonymous login, try a secure login. Note that this
           procedure is still BLOCKING. */

        Curl_sec_request_prot(conn, "private");
        /* We set private first as default, in case the line below fails to
           set a valid level */
        Curl_sec_request_prot(conn, data->set.str[STRING_KRB_LEVEL]);

        if(Curl_sec_login(conn))
          infof(data, "Logging in with password in cleartext!\n");
        else
          infof(data, "Authentication successful\n");
      }
#endif

      if(data->set.use_ssl &&
         (!conn->ssl[FIRSTSOCKET].use ||
          (conn->bits.proxy_ssl_connected[FIRSTSOCKET] &&
           !conn->proxy_ssl[FIRSTSOCKET].use))) {
        /* We don't have a SSL/TLS connection yet, but FTPS is
           requested. Try a FTPS connection now */

        ftpc->count3 = 0;
        switch(data->set.ftpsslauth) {
        case CURLFTPAUTH_DEFAULT:
        case CURLFTPAUTH_SSL:
          ftpc->count2 = 1; /* add one to get next */
          ftpc->count1 = 0;
          break;
        case CURLFTPAUTH_TLS:
          ftpc->count2 = -1; /* subtract one to get next */
          ftpc->count1 = 1;
          break;
        default:
          failf(data, "unsupported parameter to CURLOPT_FTPSSLAUTH: %d",
                (int)data->set.ftpsslauth);
          return CURLE_UNKNOWN_OPTION; /* we don't know what to do */
        }
        PPSENDF(&ftpc->pp, "AUTH %s", ftpauth[ftpc->count1]);
        state(conn, FTP_AUTH);
      }
      else {
        result = ftp_state_user(conn);
        if(result)
          return result;
      }

      break;

    case FTP_AUTH:
      /* we have gotten the response to a previous AUTH command */

      /* RFC2228 (page 5) says:
       *
       * If the server is willing to accept the named security mechanism,
       * and does not require any security data, it must respond with
       * reply code 234/334.
       */

      if((ftpcode == 234) || (ftpcode == 334)) {
        /* Curl_ssl_connect is BLOCKING */
        result = Curl_ssl_connect(conn, FIRSTSOCKET);
        if(!result) {
          conn->bits.ftp_use_data_ssl = FALSE; /* clear-text data */
          result = ftp_state_user(conn);
        }
      }
      else if(ftpc->count3 < 1) {
        ftpc->count3++;
        ftpc->count1 += ftpc->count2; /* get next attempt */
        result = Curl_pp_sendf(&ftpc->pp, "AUTH %s", ftpauth[ftpc->count1]);
        /* remain in this same state */
      }
      else {
        if(data->set.use_ssl > CURLUSESSL_TRY)
          /* we failed and CURLUSESSL_CONTROL or CURLUSESSL_ALL is set */
          result = CURLE_USE_SSL_FAILED;
        else
          /* ignore the failure and continue */
          result = ftp_state_user(conn);
      }

      if(result)
        return result;
      break;

    case FTP_USER:
    case FTP_PASS:
      result = ftp_state_user_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_ACCT:
      result = ftp_state_acct_resp(conn, ftpcode);
      break;

    case FTP_PBSZ:
      PPSENDF(&ftpc->pp, "PROT %c",
              data->set.use_ssl == CURLUSESSL_CONTROL ? 'C' : 'P');
      state(conn, FTP_PROT);

      break;

    case FTP_PROT:
      if(ftpcode/100 == 2)
        /* We have enabled SSL for the data connection! */
        conn->bits.ftp_use_data_ssl =
          (data->set.use_ssl != CURLUSESSL_CONTROL) ? TRUE : FALSE;
      /* FTP servers typically responds with 500 if they decide to reject
         our 'P' request */
      else if(data->set.use_ssl > CURLUSESSL_CONTROL)
        /* we failed and bails out */
        return CURLE_USE_SSL_FAILED;

      if(data->set.ftp_ccc) {
        /* CCC - Clear Command Channel
         */
        PPSENDF(&ftpc->pp, "%s", "CCC");
        state(conn, FTP_CCC);
      }
      else {
        result = ftp_state_pwd(conn);
        if(result)
          return result;
      }
      break;

    case FTP_CCC:
      if(ftpcode < 500) {
        /* First shut down the SSL layer (note: this call will block) */
        result = Curl_ssl_shutdown(conn, FIRSTSOCKET);

        if(result) {
          failf(conn->data, "Failed to clear the command channel (CCC)");
          return result;
        }
      }

      /* Then continue as normal */
      result = ftp_state_pwd(conn);
      if(result)
        return result;
      break;

    case FTP_PWD:
      if(ftpcode == 257) {
        char *ptr = &data->state.buffer[4];  /* start on the first letter */
        const size_t buf_size = data->set.buffer_size;
        char *dir;
        bool entry_extracted = FALSE;

        dir = malloc(nread + 1);
        if(!dir)
          return CURLE_OUT_OF_MEMORY;

        /* Reply format is like
           257<space>[rubbish]"<directory-name>"<space><commentary> and the
           RFC959 says

           The directory name can contain any character; embedded
           double-quotes should be escaped by double-quotes (the
           "quote-doubling" convention).
        */

        /* scan for the first double-quote for non-standard responses */
        while(ptr < &data->state.buffer[buf_size]
              && *ptr != '\n' && *ptr != '\0' && *ptr != '"')
          ptr++;

        if('\"' == *ptr) {
          /* it started good */
          char *store;
          ptr++;
          for(store = dir; *ptr;) {
            if('\"' == *ptr) {
              if('\"' == ptr[1]) {
                /* "quote-doubling" */
                *store = ptr[1];
                ptr++;
              }
              else {
                /* end of path */
                entry_extracted = TRUE;
                break; /* get out of this loop */
              }
            }
            else
              *store = *ptr;
            store++;
            ptr++;
          }
          *store = '\0'; /* zero terminate */
        }
        if(entry_extracted) {
          /* If the path name does not look like an absolute path (i.e.: it
             does not start with a '/'), we probably need some server-dependent
             adjustments. For example, this is the case when connecting to
             an OS400 FTP server: this server supports two name syntaxes,
             the default one being incompatible with standard paths. In
             addition, this server switches automatically to the regular path
             syntax when one is encountered in a command: this results in
             having an entrypath in the wrong syntax when later used in CWD.
               The method used here is to check the server OS: we do it only
             if the path name looks strange to minimize overhead on other
             systems. */

          if(!ftpc->server_os && dir[0] != '/') {

            result = Curl_pp_sendf(&ftpc->pp, "%s", "SYST");
            if(result) {
              free(dir);
              return result;
            }
            Curl_safefree(ftpc->entrypath);
            ftpc->entrypath = dir; /* remember this */
            infof(data, "Entry path is '%s'\n", ftpc->entrypath);
            /* also save it where getinfo can access it: */
            data->state.most_recent_ftp_entrypath = ftpc->entrypath;
            state(conn, FTP_SYST);
            break;
          }

          Curl_safefree(ftpc->entrypath);
          ftpc->entrypath = dir; /* remember this */
          infof(data, "Entry path is '%s'\n", ftpc->entrypath);
          /* also save it where getinfo can access it: */
          data->state.most_recent_ftp_entrypath = ftpc->entrypath;
        }
        else {
          /* couldn't get the path */
          free(dir);
          infof(data, "Failed to figure out path\n");
        }
      }
      state(conn, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE\n"));
      break;

    case FTP_SYST:
      if(ftpcode == 215) {
        char *ptr = &data->state.buffer[4];  /* start on the first letter */
        char *os;
        char *store;

        os = malloc(nread + 1);
        if(!os)
          return CURLE_OUT_OF_MEMORY;

        /* Reply format is like
           215<space><OS-name><space><commentary>
        */
        while(*ptr == ' ')
          ptr++;
        for(store = os; *ptr && *ptr != ' ';)
          *store++ = *ptr++;
        *store = '\0'; /* zero terminate */

        /* Check for special servers here. */

        if(strcasecompare(os, "OS/400")) {
          /* Force OS400 name format 1. */
          result = Curl_pp_sendf(&ftpc->pp, "%s", "SITE NAMEFMT 1");
          if(result) {
            free(os);
            return result;
          }
          /* remember target server OS */
          Curl_safefree(ftpc->server_os);
          ftpc->server_os = os;
          state(conn, FTP_NAMEFMT);
          break;
        }
        /* Nothing special for the target server. */
        /* remember target server OS */
        Curl_safefree(ftpc->server_os);
        ftpc->server_os = os;
      }
      else {
        /* Cannot identify server OS. Continue anyway and cross fingers. */
      }

      state(conn, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE\n"));
      break;

    case FTP_NAMEFMT:
      if(ftpcode == 250) {
        /* Name format change successful: reload initial path. */
        ftp_state_pwd(conn);
        break;
      }

      state(conn, FTP_STOP); /* we are done with the CONNECT phase! */
      DEBUGF(infof(data, "protocol connect phase DONE\n"));
      break;

    case FTP_QUOTE:
    case FTP_POSTQUOTE:
    case FTP_RETR_PREQUOTE:
    case FTP_STOR_PREQUOTE:
      if((ftpcode >= 400) && !ftpc->count2) {
        /* failure response code, and not allowed to fail */
        failf(conn->data, "QUOT command failed with %03d", ftpcode);
        return CURLE_QUOTE_ERROR;
      }
      result = ftp_state_quote(conn, FALSE, ftpc->state);
      if(result)
        return result;

      break;

    case FTP_CWD:
      if(ftpcode/100 != 2) {
        /* failure to CWD there */
        if(conn->data->set.ftp_create_missing_dirs &&
           ftpc->cwdcount && !ftpc->count2) {
          /* try making it */
          ftpc->count2++; /* counter to prevent CWD-MKD loops */
          PPSENDF(&ftpc->pp, "MKD %s", ftpc->dirs[ftpc->cwdcount - 1]);
          state(conn, FTP_MKD);
        }
        else {
          /* return failure */
          failf(data, "Server denied you to change to the given directory");
          ftpc->cwdfail = TRUE; /* don't remember this path as we failed
                                   to enter it */
          return CURLE_REMOTE_ACCESS_DENIED;
        }
      }
      else {
        /* success */
        ftpc->count2 = 0;
        if(++ftpc->cwdcount <= ftpc->dirdepth) {
          /* send next CWD */
          PPSENDF(&ftpc->pp, "CWD %s", ftpc->dirs[ftpc->cwdcount - 1]);
        }
        else {
          result = ftp_state_mdtm(conn);
          if(result)
            return result;
        }
      }
      break;

    case FTP_MKD:
      if((ftpcode/100 != 2) && !ftpc->count3--) {
        /* failure to MKD the dir */
        failf(data, "Failed to MKD dir: %03d", ftpcode);
        return CURLE_REMOTE_ACCESS_DENIED;
      }
      state(conn, FTP_CWD);
      /* send CWD */
      PPSENDF(&ftpc->pp, "CWD %s", ftpc->dirs[ftpc->cwdcount - 1]);
      break;

    case FTP_MDTM:
      result = ftp_state_mdtm_resp(conn, ftpcode);
      break;

    case FTP_TYPE:
    case FTP_LIST_TYPE:
    case FTP_RETR_TYPE:
    case FTP_STOR_TYPE:
      result = ftp_state_type_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_SIZE:
    case FTP_RETR_SIZE:
    case FTP_STOR_SIZE:
      result = ftp_state_size_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_REST:
    case FTP_RETR_REST:
      result = ftp_state_rest_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_PRET:
      if(ftpcode != 200) {
        /* there only is this one standard OK return code. */
        failf(data, "PRET command not accepted: %03d", ftpcode);
        return CURLE_FTP_PRET_FAILED;
      }
      result = ftp_state_use_pasv(conn);
      break;

    case FTP_PASV:
      result = ftp_state_pasv_resp(conn, ftpcode);
      break;

    case FTP_PORT:
      result = ftp_state_port_resp(conn, ftpcode);
      break;

    case FTP_LIST:
    case FTP_RETR:
      result = ftp_state_get_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_STOR:
      result = ftp_state_stor_resp(conn, ftpcode, ftpc->state);
      break;

    case FTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, FTP_STOP);
      break;
    }
  } /* if(ftpcode) */

  return result;
}